

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O1

void __thiscall DbCheckPostLower::EnsureValidEndBoundary(DbCheckPostLower *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  LabelInstr *pLVar4;
  undefined4 *puVar5;
  
  if ((instr->m_kind != InstrKindLabel) && (instr->m_kind != InstrKindProfiledLabel)) {
    OVar1 = instr->m_opcode;
    if ((OVar1 != CMP) && ((OVar1 != JMP && (OVar1 != TEST)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x12e,"(IsEndBoundary(instr))",
                         "Nested helper call. Not a valid end boundary.");
      if (!bVar3) goto LAB_00408ac7;
      *puVar5 = 0;
    }
  }
  if ((instr->m_kind == InstrKindProfiledLabel) || (instr->m_kind == InstrKindLabel)) {
    pLVar4 = IR::Instr::GetNextNonEmptyLabel(instr);
    if ((pLVar4->field_0x78 & 2) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x132,"(false)","Nested helper call. Falling through a helper label.");
      if (!bVar3) goto LAB_00408ac7;
      *puVar5 = 0;
    }
  }
  if (instr->m_opcode == JMP) {
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar3) goto LAB_00408ac7;
      *puVar5 = 0;
    }
    pLVar4 = IR::Instr::GetNextNonEmptyLabel(instr[1].m_next);
    if ((pLVar4->field_0x78 & 2) != 0) {
      IR::Instr::Dump(instr);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0x138,"(false)","Nested helper call. Jumping to a helper label.");
      if (!bVar3) {
LAB_00408ac7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void
DbCheckPostLower::EnsureValidEndBoundary(IR::Instr *instr)
{
    AssertMsg(IsEndBoundary(instr), "Nested helper call. Not a valid end boundary.");
    if (instr->IsLabelInstr() && instr->AsLabelInstr()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Falling through a helper label.");
    }

    if (instr->m_opcode == Js::OpCode::JMP && instr->AsBranchInstr()->GetTarget()->GetNextNonEmptyLabel()->isOpHelper)
    {
        instr->Dump();
        AssertMsg(false, "Nested helper call. Jumping to a helper label.");
    }
}